

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O2

SHEMU_STATUS ShemuMemFetch(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Bytes)

{
  ND_BOOL NVar1;
  ulong uVar2;
  long lVar3;
  SHEMU_ICACHE *pSVar4;
  
  if (Size - 0x101 < 0xffffffffffffff00) {
    return 7;
  }
  NVar1 = ShemuIsShellcodePtr(Context,Gla,Size);
  if (NVar1 == '\0') {
    return 2;
  }
  lVar3 = Gla - Context->ShellcodeBase;
  if ((Context->Options & 0x20) == 0) {
    pSVar4 = (SHEMU_ICACHE *)Context->Shellcode;
  }
  else {
    NVar1 = ShemuIsIcachePtr(Context,Gla,1);
    if ((NVar1 == '\0') || (NVar1 = ShemuIsIcachePtr(Context,(Gla - 1) + Size,1), NVar1 == '\0')) {
      (Context->Icache).Address = Gla;
      uVar2 = Context->ShellcodeSize - lVar3;
      if (0xff < uVar2) {
        uVar2 = 0x100;
      }
      (Context->Icache).Size = uVar2;
      if (uVar2 < Size) {
        return 2;
      }
      if (Context->AccessShellcode == (ShemuMemAccess)0x0) {
        return 0xf;
      }
      NVar1 = (*Context->AccessShellcode)(Context,Gla,uVar2,(Context->Icache).Icache,'\0');
      if (NVar1 == '\0') {
        return 0xf;
      }
    }
    lVar3 = Gla - (Context->Icache).Address;
    pSVar4 = &Context->Icache;
  }
  shemu_memcpy(Bytes,pSVar4->Icache + lVar3,Size);
  return 0;
}

Assistant:

SHEMU_STATUS
ShemuMemFetch(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Bytes
    )
{
    ND_UINT8 *addr;
    ND_UINT64 offset;

    if (Size > SHEMU_ICACHE_SIZE || Size == 0)
    {
        return SHEMU_ABORT_INVALID_PARAMETER;
    }

    if (!ShemuIsShellcodePtr(Context, Gla, Size))
    {
        return SHEMU_ABORT_RIP_OUTSIDE;
    }

    addr = Context->Shellcode;
    offset = Gla - Context->ShellcodeBase;

    if (0 != (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
    {
        // If the entire address is NOT inside the cache, re-fill the entire line, starting with Gla.
        if (!ShemuIsIcachePtr(Context, Gla, 1) || !ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            // Re-fill the line.
            Context->Icache.Address = Gla;
            Context->Icache.Size = MIN(SHEMU_ICACHE_SIZE, Context->ShellcodeSize - offset);

            if (Context->Icache.Size < Size)
            {
                return SHEMU_ABORT_RIP_OUTSIDE;
            }

            if ((ND_NULL == Context->AccessShellcode) || 
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Context->Icache.Size, Context->Icache.Icache, ND_FALSE))
            {
                return SHEMU_ABORT_FETCH_ERROR;
            }
        }

        addr = Context->Icache.Icache;
        offset = Gla - Context->Icache.Address;
    }

    shemu_memcpy(Bytes, addr + offset, (ND_SIZET)Size);

    return SHEMU_SUCCESS;
}